

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InlineQueryResultCachedDocument.h
# Opt level: O0

void __thiscall
TgBot::InlineQueryResultCachedDocument::InlineQueryResultCachedDocument
          (InlineQueryResultCachedDocument *this)

{
  InlineQueryResultCachedDocument *this_local;
  
  InlineQueryResult::InlineQueryResult(&this->super_InlineQueryResult);
  (this->super_InlineQueryResult)._vptr_InlineQueryResult =
       (_func_int **)&PTR__InlineQueryResultCachedDocument_0051ac28;
  std::__cxx11::string::string((string *)&this->documentFileId);
  std::__cxx11::string::string((string *)&this->description);
  std::__cxx11::string::operator=
            ((string *)&(this->super_InlineQueryResult).type,(string *)&TYPE_abi_cxx11_);
  return;
}

Assistant:

InlineQueryResultCachedDocument() {
        this->type = TYPE;
    }